

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O3

compile_errcode __thiscall FunctionCall::Action(FunctionCall *this)

{
  int iVar1;
  int line_number;
  int character_number;
  pointer pSVar2;
  SymbolName SVar3;
  compile_errcode cVar4;
  uint uVar5;
  vector<_SymbolType,_std::allocator<_SymbolType>_> argument_type;
  string identifier_name;
  vector<_SymbolType,_std::allocator<_SymbolType>_> local_88;
  string local_70;
  string local_50;
  
  local_88.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar5 = 0;
  local_88.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
LAB_00132813:
  do {
    SVar3 = SymbolQueue::GetCurrentName(handle_correct_queue);
    if (4 < uVar5) goto LAB_001328eb;
    iVar1 = handle_correct_queue->m_current_locate;
    pSVar2 = (handle_correct_queue->m_symbol_queue).
             super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.super__Vector_impl_data.
             _M_start;
    line_number = pSVar2[iVar1].m_line_number;
    character_number = pSVar2[iVar1].m_character_number;
    switch(uVar5) {
    case 0:
      if (SVar3 != IDENTIFIER_SYM) {
LAB_001328f5:
        cVar4 = -1;
LAB_001328fe:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if (local_88.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        return cVar4;
      }
      c0_compile::SymbolValue::GetValue<std::__cxx11::string>(&local_50,&pSVar2[iVar1].m_value);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      IdentifierCheck(&local_70,line_number,character_number);
      uVar5 = 1;
      break;
    case 1:
      uVar5 = 2;
      if (SVar3 != L_CIRCLE_BRACKET_SYM) goto LAB_001328f5;
      break;
    case 2:
      cVar4 = ValueArgumentList::Action(&this->m_value_argument_list,&local_88);
      if (cVar4 == 0) goto code_r0x001328b8;
      goto LAB_001328f5;
    case 3:
      uVar5 = 4;
      if (SVar3 != R_CIRCLE_BRACKET_SYM) goto LAB_001328f5;
      break;
    case 4:
      cVar4 = 0;
      goto LAB_001328fe;
    }
LAB_001328eb:
    SymbolQueue::NextSymbol(handle_correct_queue);
  } while( true );
code_r0x001328b8:
  uVar5 = 3;
  ArgumentCheck(&local_70,line_number,character_number,&local_88);
  goto LAB_00132813;
}

Assistant:

compile_errcode FunctionCall::Action() {
    int ret = COMPILE_OK;
    int state = 0;
    vector<SymbolType> argument_type;
    string identifier_name;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        int line_number = handle_correct_queue->GetCurrentLine();
        int character_number = handle_correct_queue->GetCurrentCharacter();
        switch (state) {
            case 0: {
                if (name == IDENTIFIER_SYM) {
                    identifier_name = handle_correct_queue->GetCurrentValue<string>();
                    IdentifierCheck(identifier_name, line_number, character_number);
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == L_CIRCLE_BRACKET_SYM) {
                    state = 2;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 2: {
                if ((ret = m_value_argument_list.Action(argument_type)) == COMPILE_OK) {
                    ArgumentCheck(identifier_name, line_number, character_number, argument_type);
                    state = 3;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 3: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 4;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 4: return COMPILE_OK;
        }
        if (state != 3)
            handle_correct_queue->NextSymbol();
    }
}